

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

Constant * LLVMBC::dyn_cast<LLVMBC::Constant>(Value *value)

{
  bool bVar1;
  ValueKind kind;
  Constant *this;
  Constant *pCVar2;
  
  if (value != (Value *)0x0) {
    this = (Constant *)Internal::resolve_proxy(value);
    kind = Value::get_value_kind((Value *)this);
    bVar1 = Constant::is_base_of_value_kind(kind);
    pCVar2 = (Constant *)0x0;
    if (bVar1) {
      pCVar2 = this;
    }
    return pCVar2;
  }
  return (Constant *)0x0;
}

Assistant:

inline const T *dyn_cast(const Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
		return nullptr;
}